

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O3

tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> * __thiscall
Secp256K1::Sign(tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>
                *__return_storage_ptr__,Secp256K1 *this,uint8_t *hash)

{
  _Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *this_00;
  int iVar1;
  pointer puVar2;
  value_type_conflict *__val;
  size_t __n;
  size_t sigOutSize;
  secp256k1_ecdsa_signature sig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  size_t local_68;
  secp256k1_ecdsa_signature local_60;
  
  iVar1 = secp256k1_ecdsa_sign
                    (this->ctx,&local_60,hash,
                     (this->privKey).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,nonce_function_rfc6979,(void *)0x0);
  if (iVar1 == 1) {
    puVar2 = (pointer)operator_new(0x48);
    local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + 0x48;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\0';
    puVar2[0xc] = '\0';
    puVar2[0xd] = '\0';
    puVar2[0xe] = '\0';
    puVar2[0xf] = '\0';
    puVar2[0x10] = '\0';
    puVar2[0x11] = '\0';
    puVar2[0x12] = '\0';
    puVar2[0x13] = '\0';
    puVar2[0x14] = '\0';
    puVar2[0x15] = '\0';
    puVar2[0x16] = '\0';
    puVar2[0x17] = '\0';
    puVar2[0x18] = '\0';
    puVar2[0x19] = '\0';
    puVar2[0x1a] = '\0';
    puVar2[0x1b] = '\0';
    puVar2[0x1c] = '\0';
    puVar2[0x1d] = '\0';
    puVar2[0x1e] = '\0';
    puVar2[0x1f] = '\0';
    puVar2[0x20] = '\0';
    puVar2[0x21] = '\0';
    puVar2[0x22] = '\0';
    puVar2[0x23] = '\0';
    puVar2[0x24] = '\0';
    puVar2[0x25] = '\0';
    puVar2[0x26] = '\0';
    puVar2[0x27] = '\0';
    puVar2[0x28] = '\0';
    puVar2[0x29] = '\0';
    puVar2[0x2a] = '\0';
    puVar2[0x2b] = '\0';
    puVar2[0x2c] = '\0';
    puVar2[0x2d] = '\0';
    puVar2[0x2e] = '\0';
    puVar2[0x2f] = '\0';
    puVar2[0x30] = '\0';
    puVar2[0x31] = '\0';
    puVar2[0x32] = '\0';
    puVar2[0x33] = '\0';
    puVar2[0x34] = '\0';
    puVar2[0x35] = '\0';
    puVar2[0x36] = '\0';
    puVar2[0x37] = '\0';
    puVar2[0x38] = '\0';
    puVar2[0x39] = '\0';
    puVar2[0x3a] = '\0';
    puVar2[0x3b] = '\0';
    puVar2[0x3c] = '\0';
    puVar2[0x3d] = '\0';
    puVar2[0x3e] = '\0';
    puVar2[0x3f] = '\0';
    puVar2[0x40] = '\0';
    puVar2[0x41] = '\0';
    puVar2[0x42] = '\0';
    puVar2[0x43] = '\0';
    puVar2[0x44] = '\0';
    puVar2[0x45] = '\0';
    puVar2[0x46] = '\0';
    puVar2[0x47] = '\0';
    local_68 = 0x48;
    local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar1 = secp256k1_ecdsa_signature_serialize_der(this->ctx,puVar2,&local_68,&local_60);
    if (iVar1 == 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_80,local_68);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = true;
      this_00 = &(__return_storage_ptr__->
                 super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>
                 ).
                 super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
      ;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      puVar2 = (this_00->_M_head_impl).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      if (__n != 0) {
        memmove(puVar2,local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
      }
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2 + __n;
      puVar2 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (uchar *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    operator_delete(puVar2,(long)local_80.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  else {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::vector<uint8_t>, bool> Secp256K1::Sign(
    const uint8_t* hash) const
{
    // Make signature.
    secp256k1_ecdsa_signature sig;
    int ret = secp256k1_ecdsa_sign(ctx, &sig, hash, privKey.data(),
        secp256k1_nonce_function_rfc6979, nullptr);
    if (ret != 1) {
        // Failed to sign.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Serialize signature.
    std::vector<uint8_t> sigOut(72);
    size_t sigOutSize = 72;
    ret = secp256k1_ecdsa_signature_serialize_der(
        ctx, &sigOut[0], &sigOutSize, &sig);
    if (ret != 1) {
        // Failed to serialize.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Returns
    sigOut.resize(sigOutSize);
    return std::make_tuple(sigOut, true);
}